

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdUpdateTxInScriptSig
              (void *handle,void *create_handle,char *txid,uint32_t vout,char *script_sig)

{
  Transaction *this;
  ConfidentialTransaction *this_00;
  undefined1 uVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  string *message;
  uint in_ECX;
  char *in_RDX;
  long in_RSI;
  CfdException *in_R8;
  CfdException *except;
  exception *std_except;
  uint32_t index_1;
  ConfidentialTransactionContext *tx_1;
  uint32_t index;
  TransactionContext *tx;
  bool is_bitcoin;
  Script script;
  Txid txid_obj;
  CfdCapiTransactionData *tx_data;
  int result;
  Script *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  CfdError error_code;
  allocator *paVar5;
  CfdException *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdf8;
  long lVar6;
  int network_type;
  allocator local_1b9;
  string local_1b8 [38];
  byte local_192;
  allocator local_191;
  string local_190;
  string *in_stack_fffffffffffffea8;
  pointer in_stack_fffffffffffffeb0;
  Script local_138;
  allocator local_f9;
  string local_f8;
  Txid local_d8;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [52];
  undefined4 local_34;
  CfdException *local_30;
  uint local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  lVar6 = local_18;
  std::allocator<char>::allocator();
  network_type = (int)((ulong)lVar6 >> 0x20);
  std::__cxx11::string::string(local_68,"TransactionData",&local_69);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  uVar1 = cfd::capi::IsEmptyString(local_20);
  if ((bool)uVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x2ec;
    local_90.funcname = "CfdUpdateTxInScriptSig";
    cfd::core::logger::warn<>(&local_90,"txid is null or empty.");
    local_b2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. txid is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
    local_b2 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,local_20,&local_f9);
  cfd::core::Txid::Txid(&local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  cfd::core::Script::Script(&local_138);
  bVar2 = cfd::capi::IsEmptyString((char *)local_30);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,(char *)local_30,&local_191);
    cfd::core::Script::Script((Script *)&stack0xfffffffffffffe90,&local_190);
    cfd::core::Script::operator=(&local_138,(Script *)&stack0xfffffffffffffe90);
    cfd::core::Script::~Script(in_stack_fffffffffffffda0);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    in_stack_fffffffffffffdc0 = local_30;
  }
  local_192 = 0;
  cfd::capi::ConvertNetType(network_type,(bool *)CONCAT17(uVar1,in_stack_fffffffffffffdf8));
  if (*(long *)(local_78 + 0x18) == 0) {
    message = (string *)__cxa_allocate_exception(0x30);
    paVar5 = &local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"Invalid handle state. tx is null",paVar5);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdc0,(CfdError)((ulong)paVar5 >> 0x20),message);
    __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_192 & 1) == 0) {
    this_00 = *(ConfidentialTransaction **)(local_78 + 0x18);
    uVar3 = (*(this_00->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                      (this_00,&local_d8,(ulong)local_24);
    cfd::core::ConfidentialTransaction::SetUnlockingScript(this_00,uVar3,&local_138);
  }
  else {
    this = *(Transaction **)(local_78 + 0x18);
    uVar3 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                      (this,&local_d8,(ulong)local_24);
    cfd::core::Transaction::SetUnlockingScript(this,uVar3,&local_138);
  }
  local_4 = 0;
  cfd::core::Script::~Script(in_stack_fffffffffffffda0);
  cfd::core::Txid::~Txid((Txid *)0x60baba);
  return local_4;
}

Assistant:

int CfdUpdateTxInScriptSig(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    const char* script_sig) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    Script script;
    if (!IsEmptyString(script_sig)) script = Script(script_sig);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->SetUnlockingScript(index, script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->SetUnlockingScript(index, script);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}